

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FAudio.c
# Opt level: O3

uint32_t FAudio_CreateSourceVoice
                   (FAudio *audio,FAudioSourceVoice **ppSourceVoice,
                   FAudioWaveFormatEx *pSourceFormat,uint32_t Flags,float MaxFrequencyRatio,
                   FAudioVoiceCallback *pCallback,FAudioVoiceSends *pSendList,
                   FAudioEffectChain *pEffectChain)

{
  undefined1 *puVar1;
  ushort uVar2;
  uint16_t uVar3;
  FAudioVoice *voice;
  uint32_t uVar4;
  undefined1 auVar5 [16];
  int iVar6;
  FAudioSourceVoice *pFVar7;
  FAudioMutex pvVar8;
  FAudioWaveFormatEx *pFVar9;
  float *pfVar10;
  FAudioFilterState *pafVar11;
  code *pcVar12;
  ulong uVar13;
  ulong uVar14;
  FAudioGUID *pFVar15;
  long lVar16;
  double dVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  int iVar22;
  
  pFVar7 = (FAudioSourceVoice *)(*audio->pMalloc)(0x148);
  *ppSourceVoice = pFVar7;
  SDL_memset(pFVar7,0,0x148);
  (*ppSourceVoice)->audio = audio;
  pFVar7 = *ppSourceVoice;
  pFVar7->type = FAUDIO_VOICE_SOURCE;
  pFVar7->flags = Flags;
  (pFVar7->filter).Type = FAudioLowPassFilter;
  (pFVar7->filter).Frequency = 1.0;
  (pFVar7->filter).OneOverQ = 1.0;
  pvVar8 = FAudio_PlatformCreateMutex();
  (*ppSourceVoice)->sendLock = pvVar8;
  pvVar8 = FAudio_PlatformCreateMutex();
  (*ppSourceVoice)->effectLock = pvVar8;
  pvVar8 = FAudio_PlatformCreateMutex();
  (*ppSourceVoice)->filterLock = pvVar8;
  pvVar8 = FAudio_PlatformCreateMutex();
  (*ppSourceVoice)->volumeLock = pvVar8;
  ((*ppSourceVoice)->field_19).src.maxFreqRatio = MaxFrequencyRatio;
  uVar2 = pSourceFormat->wFormatTag;
  if (uVar2 < 3) {
    if (uVar2 == 1) goto LAB_001140d9;
    if (uVar2 == 2) {
      pFVar9 = (FAudioWaveFormatEx *)(*audio->pMalloc)(0x16);
      uVar13 = (ulong)pSourceFormat->cbSize;
      lVar16 = 0x16;
      if (uVar13 < 4) {
        lVar16 = uVar13 + 0x12;
      }
      SDL_memcpy(pFVar9,pSourceFormat,lVar16);
      if (uVar13 < 4) {
        SDL_memset((long)&pFVar9[1].wFormatTag + uVar13,0,4 - uVar13);
      }
      pFVar9->cbSize = 4;
      pFVar9[1].wFormatTag = (pFVar9->nBlockAlign / pFVar9->nChannels) * 2 - 0xc;
      goto LAB_001141ae;
    }
LAB_001141c4:
    pFVar9 = (FAudioWaveFormatEx *)(*audio->pMalloc)((ulong)pSourceFormat->cbSize + 0x12);
    ((*ppSourceVoice)->field_19).src.format = pFVar9;
    SDL_memcpy(((*ppSourceVoice)->field_19).src.format,pSourceFormat,
               (ulong)pSourceFormat->cbSize + 0x12);
  }
  else {
    if (uVar2 != 3) {
      if (uVar2 == 0x166) {
        pFVar9 = (FAudioWaveFormatEx *)(*audio->pMalloc)(0x34);
        uVar13 = (ulong)pSourceFormat->cbSize;
        lVar16 = 0x34;
        if (uVar13 < 0x22) {
          lVar16 = uVar13 + 0x12;
        }
        SDL_memcpy(pFVar9,pSourceFormat,lVar16);
        if (uVar13 < 0x22) {
          SDL_memset((long)&pFVar9[1].wFormatTag + uVar13,0,4 - uVar13);
        }
        pFVar9->cbSize = 0x22;
LAB_001141ae:
        ((*ppSourceVoice)->field_19).src.format = pFVar9;
        goto LAB_0011422f;
      }
      if (uVar2 != 0x161) goto LAB_001141c4;
    }
LAB_001140d9:
    pFVar9 = (FAudioWaveFormatEx *)(*audio->pMalloc)(0x28);
    pFVar9->wFormatTag = 0xfffe;
    pFVar9->nChannels = pSourceFormat->nChannels;
    uVar4 = pSourceFormat->nAvgBytesPerSec;
    pFVar9->nSamplesPerSec = pSourceFormat->nSamplesPerSec;
    pFVar9->nAvgBytesPerSec = uVar4;
    uVar3 = pSourceFormat->wBitsPerSample;
    pFVar9->nBlockAlign = pSourceFormat->nBlockAlign;
    pFVar9->wBitsPerSample = uVar3;
    pFVar9->cbSize = 0x16;
    pFVar9[1].wFormatTag = pSourceFormat->wBitsPerSample;
    *(undefined4 *)&pFVar9[1].nChannels = 0;
    uVar3 = pSourceFormat->wFormatTag;
    if (uVar3 == 1) {
      pFVar15 = &DATAFORMAT_SUBTYPE_PCM;
LAB_00114214:
      SDL_memcpy((undefined1 *)((long)&pFVar9[1].nSamplesPerSec + 2),pFVar15,0x10);
    }
    else {
      if (uVar3 == 0x161) {
        pFVar15 = &DATAFORMAT_SUBTYPE_WMAUDIO2;
        goto LAB_00114214;
      }
      if (uVar3 == 3) {
        pFVar15 = &DATAFORMAT_SUBTYPE_IEEE_FLOAT;
        goto LAB_00114214;
      }
    }
    ((*ppSourceVoice)->field_19).src.format = pFVar9;
  }
LAB_0011422f:
  ((*ppSourceVoice)->field_19).src.callback = pCallback;
  ((*ppSourceVoice)->field_19).src.active = '\0';
  ((*ppSourceVoice)->field_19).src.freqRatio = 1.0;
  ((*ppSourceVoice)->field_19).src.totalSamples = 0;
  ((*ppSourceVoice)->field_19).src.bufferList = (FAudioBufferEntry *)0x0;
  ((*ppSourceVoice)->field_19).src.flushList = (FAudioBufferEntry *)0x0;
  pvVar8 = FAudio_PlatformCreateMutex();
  ((*ppSourceVoice)->field_19).src.bufferLock = pvVar8;
  pFVar7 = *ppSourceVoice;
  pFVar9 = (pFVar7->field_19).src.format;
  uVar3 = pFVar9->wFormatTag;
  if (uVar3 == 2) {
    if (pFVar9->nChannels == 2) {
      pcVar12 = FAudio_INTERNAL_DecodeStereoMSADPCM;
    }
    else {
      pcVar12 = FAudio_INTERNAL_DecodeMonoMSADPCM;
    }
    goto LAB_001143c6;
  }
  if (uVar3 == 0x166) {
LAB_00114339:
    pcVar12 = FAudio_INTERNAL_DecodeWMAERROR;
  }
  else {
    if (uVar3 != 0xfffe) goto switchD_00114382_default;
    puVar1 = (undefined1 *)((long)&pFVar9[1].nSamplesPerSec + 2);
    iVar6 = SDL_memcmp(puVar1,&DATAFORMAT_SUBTYPE_PCM,0x10);
    if (iVar6 == 0) {
      switch(pFVar9->wBitsPerSample << 0xd | (ushort)(pFVar9->wBitsPerSample - 8) >> 3) {
      case 0:
        pFVar7 = *ppSourceVoice;
        pcVar12 = FAudio_INTERNAL_DecodePCM8;
        break;
      case 1:
        pFVar7 = *ppSourceVoice;
LAB_001143bf:
        pcVar12 = FAudio_INTERNAL_DecodePCM16;
        break;
      case 2:
        pFVar7 = *ppSourceVoice;
        pcVar12 = FAudio_INTERNAL_DecodePCM24;
        break;
      case 3:
        pFVar7 = *ppSourceVoice;
        pcVar12 = FAudio_INTERNAL_DecodePCM32;
        break;
      default:
        goto switchD_00114382_default;
      }
    }
    else {
      iVar6 = SDL_memcmp(puVar1,&DATAFORMAT_SUBTYPE_IEEE_FLOAT,0x10);
      if (iVar6 != 0) {
        iVar6 = SDL_memcmp(puVar1,&DATAFORMAT_SUBTYPE_WMAUDIO2,0x10);
        if (((iVar6 != 0) &&
            (iVar6 = SDL_memcmp(puVar1,&DATAFORMAT_SUBTYPE_WMAUDIO3,0x10), iVar6 != 0)) &&
           (iVar6 = SDL_memcmp(puVar1,&DATAFORMAT_SUBTYPE_WMAUDIO_LOSSLESS,0x10), iVar6 != 0))
        goto switchD_00114382_default;
        pFVar7 = *ppSourceVoice;
        goto LAB_00114339;
      }
      pFVar7 = *ppSourceVoice;
      if (pFVar9->wBitsPerSample == 0x10) goto LAB_001143bf;
      pcVar12 = FAudio_INTERNAL_DecodePCM32F;
    }
  }
LAB_001143c6:
  (pFVar7->field_19).src.decode = pcVar12;
switchD_00114382_default:
  uVar3 = (((*ppSourceVoice)->field_19).src.format)->nChannels;
  pcVar12 = FAudio_INTERNAL_ResampleStereo;
  if ((uVar3 != 2) && (pcVar12 = FAudio_INTERNAL_ResampleMono, uVar3 != 1)) {
    pcVar12 = FAudio_INTERNAL_ResampleGeneric;
  }
  ((*ppSourceVoice)->field_19).src.resample = pcVar12;
  ((*ppSourceVoice)->field_19).src.curBufferOffset = 0;
  FAudio_INTERNAL_VoiceOutputFrequency(*ppSourceVoice,pSendList);
  FAudioVoice_SetEffectChain(*ppSourceVoice,pEffectChain);
  pFVar7 = *ppSourceVoice;
  pFVar7->volume = 1.0;
  pfVar10 = (float *)(*audio->pMalloc)((ulong)pFVar7->outputChannels << 2);
  (*ppSourceVoice)->channelVolume = pfVar10;
  auVar5 = _DAT_00126030;
  voice = *ppSourceVoice;
  uVar13 = (ulong)voice->outputChannels;
  if (uVar13 != 0) {
    pfVar10 = voice->channelVolume;
    lVar16 = uVar13 - 1;
    auVar18._8_4_ = (int)lVar16;
    auVar18._0_8_ = lVar16;
    auVar18._12_4_ = (int)((ulong)lVar16 >> 0x20);
    uVar14 = 0;
    auVar18 = auVar18 ^ _DAT_00126030;
    auVar19 = _DAT_00126690;
    auVar20 = _DAT_001266a0;
    do {
      auVar21 = auVar20 ^ auVar5;
      iVar6 = auVar18._4_4_;
      if ((bool)(~(auVar21._4_4_ == iVar6 && auVar18._0_4_ < auVar21._0_4_ || iVar6 < auVar21._4_4_)
                & 1)) {
        *(undefined4 *)((long)pfVar10 + uVar14) = 0x3f800000;
      }
      if ((auVar21._12_4_ != auVar18._12_4_ || auVar21._8_4_ <= auVar18._8_4_) &&
          auVar21._12_4_ <= auVar18._12_4_) {
        *(undefined4 *)((long)pfVar10 + uVar14 + 4) = 0x3f800000;
      }
      auVar21 = auVar19 ^ auVar5;
      iVar22 = auVar21._4_4_;
      if (iVar22 <= iVar6 && (iVar22 != iVar6 || auVar21._0_4_ <= auVar18._0_4_)) {
        *(undefined4 *)((long)pfVar10 + uVar14 + 8) = 0x3f800000;
        *(undefined4 *)((long)pfVar10 + uVar14 + 0xc) = 0x3f800000;
      }
      lVar16 = auVar20._8_8_;
      auVar20._0_8_ = auVar20._0_8_ + 4;
      auVar20._8_8_ = lVar16 + 4;
      lVar16 = auVar19._8_8_;
      auVar19._0_8_ = auVar19._0_8_ + 4;
      auVar19._8_8_ = lVar16 + 4;
      uVar14 = uVar14 + 0x10;
    } while ((uVar13 * 4 + 0xc & 0xfffffffffffffff0) != uVar14);
  }
  FAudioVoice_SetOutputVoices(voice,pSendList);
  if ((Flags & 8) != 0) {
    pafVar11 = (FAudioFilterState *)
               (*audio->pMalloc)((ulong)(((*ppSourceVoice)->field_19).src.format)->nChannels << 4);
    (*ppSourceVoice)->filterState = pafVar11;
    SDL_memset((*ppSourceVoice)->filterState,0,
               (ulong)(((*ppSourceVoice)->field_19).src.format)->nChannels << 4);
  }
  dVar17 = (double)SDL_ceil(((double)(((*ppSourceVoice)->field_19).src.format)->nSamplesPerSec *
                            (double)MaxFrequencyRatio * (double)audio->updateSize) /
                            (double)(audio->master->field_19).master.inputSampleRate);
  ((*ppSourceVoice)->field_19).src.decodeSamples =
       (int)(long)dVar17 + (uint)(((*ppSourceVoice)->field_19).src.format)->nChannels * 2;
  FAudio_INTERNAL_ResizeDecodeCache
            (audio,(uint)(((*ppSourceVoice)->field_19).src.format)->nChannels *
                   (((*ppSourceVoice)->field_19).src.decodeSamples + 2));
  LinkedList_PrependEntry(&audio->sources,*ppSourceVoice,audio->sourceLock,audio->pMalloc);
  audio->refcount = audio->refcount + 1;
  return 0;
}

Assistant:

uint32_t FAudio_CreateSourceVoice(
	FAudio *audio,
	FAudioSourceVoice **ppSourceVoice,
	const FAudioWaveFormatEx *pSourceFormat,
	uint32_t Flags,
	float MaxFrequencyRatio,
	FAudioVoiceCallback *pCallback,
	const FAudioVoiceSends *pSendList,
	const FAudioEffectChain *pEffectChain
) {
	uint32_t i;

	LOG_API_ENTER(audio)
	LOG_FORMAT(audio, pSourceFormat)

	*ppSourceVoice = (FAudioSourceVoice*) audio->pMalloc(sizeof(FAudioVoice));
	FAudio_zero(*ppSourceVoice, sizeof(FAudioSourceVoice));
	(*ppSourceVoice)->audio = audio;
	(*ppSourceVoice)->type = FAUDIO_VOICE_SOURCE;
	(*ppSourceVoice)->flags = Flags;
	(*ppSourceVoice)->filter.Type = FAUDIO_DEFAULT_FILTER_TYPE;
	(*ppSourceVoice)->filter.Frequency = FAUDIO_DEFAULT_FILTER_FREQUENCY;
	(*ppSourceVoice)->filter.OneOverQ = FAUDIO_DEFAULT_FILTER_ONEOVERQ;
	(*ppSourceVoice)->sendLock = FAudio_PlatformCreateMutex();
	LOG_MUTEX_CREATE(audio, (*ppSourceVoice)->sendLock)
	(*ppSourceVoice)->effectLock = FAudio_PlatformCreateMutex();
	LOG_MUTEX_CREATE(audio, (*ppSourceVoice)->effectLock)
	(*ppSourceVoice)->filterLock = FAudio_PlatformCreateMutex();
	LOG_MUTEX_CREATE(audio, (*ppSourceVoice)->filterLock)
	(*ppSourceVoice)->volumeLock = FAudio_PlatformCreateMutex();
	LOG_MUTEX_CREATE(audio, (*ppSourceVoice)->volumeLock)

	/* Source Properties */
	FAudio_assert(MaxFrequencyRatio <= FAUDIO_MAX_FREQ_RATIO);
	(*ppSourceVoice)->src.maxFreqRatio = MaxFrequencyRatio;

	if (	pSourceFormat->wFormatTag == FAUDIO_FORMAT_PCM ||
		pSourceFormat->wFormatTag == FAUDIO_FORMAT_IEEE_FLOAT ||
		pSourceFormat->wFormatTag == FAUDIO_FORMAT_WMAUDIO2	)
	{
		FAudioWaveFormatExtensible *fmtex = (FAudioWaveFormatExtensible*) audio->pMalloc(
			sizeof(FAudioWaveFormatExtensible)
		);
		/* convert PCM to EXTENSIBLE */
		fmtex->Format.wFormatTag = FAUDIO_FORMAT_EXTENSIBLE;
		fmtex->Format.nChannels = pSourceFormat->nChannels;
		fmtex->Format.nSamplesPerSec = pSourceFormat->nSamplesPerSec;
		fmtex->Format.nAvgBytesPerSec = pSourceFormat->nAvgBytesPerSec;
		fmtex->Format.nBlockAlign = pSourceFormat->nBlockAlign;
		fmtex->Format.wBitsPerSample = pSourceFormat->wBitsPerSample;
		fmtex->Format.cbSize = sizeof(FAudioWaveFormatExtensible) - sizeof(FAudioWaveFormatEx);
		fmtex->Samples.wValidBitsPerSample = pSourceFormat->wBitsPerSample;
		fmtex->dwChannelMask = 0;
		if (pSourceFormat->wFormatTag == FAUDIO_FORMAT_PCM)
		{
			FAudio_memcpy(&fmtex->SubFormat, &DATAFORMAT_SUBTYPE_PCM, sizeof(FAudioGUID));
		}
		else if (pSourceFormat->wFormatTag == FAUDIO_FORMAT_IEEE_FLOAT)
		{
			FAudio_memcpy(&fmtex->SubFormat, &DATAFORMAT_SUBTYPE_IEEE_FLOAT, sizeof(FAudioGUID));
		}
		else if (pSourceFormat->wFormatTag == FAUDIO_FORMAT_WMAUDIO2)
		{
			FAudio_memcpy(&fmtex->SubFormat, &DATAFORMAT_SUBTYPE_WMAUDIO2, sizeof(FAudioGUID));
		}
		(*ppSourceVoice)->src.format = &fmtex->Format;
	}
	else if (pSourceFormat->wFormatTag == FAUDIO_FORMAT_MSADPCM)
	{
		FAudioADPCMWaveFormat *fmtex = (FAudioADPCMWaveFormat*) audio->pMalloc(
			sizeof(FAudioADPCMWaveFormat)
		);

		/* Copy what we can, ideally the sizes match! */
		size_t cbSize = sizeof(FAudioWaveFormatEx) + pSourceFormat->cbSize;
		FAudio_memcpy(
			fmtex,
			pSourceFormat,
			FAudio_min(cbSize, sizeof(FAudioADPCMWaveFormat))
		);
		if (cbSize < sizeof(FAudioADPCMWaveFormat))
		{
			FAudio_zero(
				((uint8_t*) fmtex) + cbSize,
				sizeof(FAudioADPCMWaveFormat) - cbSize
			);
		}

		/* XAudio2 does not validate this input! */
		fmtex->wfx.cbSize = sizeof(FAudioADPCMWaveFormat) - sizeof(FAudioWaveFormatEx);
		fmtex->wSamplesPerBlock = ((
			fmtex->wfx.nBlockAlign / fmtex->wfx.nChannels
		) - 6) * 2;
		(*ppSourceVoice)->src.format = &fmtex->wfx;
	}
	else if (pSourceFormat->wFormatTag == FAUDIO_FORMAT_XMAUDIO2)
	{
		FAudioXMA2WaveFormat *fmtex = (FAudioXMA2WaveFormat*) audio->pMalloc(
			sizeof(FAudioXMA2WaveFormat)
		);

		/* Copy what we can, ideally the sizes match! */
		size_t cbSize = sizeof(FAudioWaveFormatEx) + pSourceFormat->cbSize;
		FAudio_memcpy(
			fmtex,
			pSourceFormat,
			FAudio_min(cbSize, sizeof(FAudioXMA2WaveFormat))
		);
		if (cbSize < sizeof(FAudioXMA2WaveFormat))
		{
			FAudio_zero(
				((uint8_t*) fmtex) + cbSize,
				sizeof(FAudioADPCMWaveFormat) - cbSize
			);
		}

		/* Does XAudio2 validate this input?! */
		fmtex->wfx.cbSize = sizeof(FAudioXMA2WaveFormat) - sizeof(FAudioWaveFormatEx);
		(*ppSourceVoice)->src.format = &fmtex->wfx;
	}
	else
	{
		/* direct copy anything else */
		(*ppSourceVoice)->src.format = (FAudioWaveFormatEx*) audio->pMalloc(
			sizeof(FAudioWaveFormatEx) + pSourceFormat->cbSize
		);
		FAudio_memcpy(
			(*ppSourceVoice)->src.format,
			pSourceFormat,
			sizeof(FAudioWaveFormatEx) + pSourceFormat->cbSize
		);
	}

	(*ppSourceVoice)->src.callback = pCallback;
	(*ppSourceVoice)->src.active = 0;
	(*ppSourceVoice)->src.freqRatio = 1.0f;
	(*ppSourceVoice)->src.totalSamples = 0;
	(*ppSourceVoice)->src.bufferList = NULL;
	(*ppSourceVoice)->src.flushList = NULL;
	(*ppSourceVoice)->src.bufferLock = FAudio_PlatformCreateMutex();
	LOG_MUTEX_CREATE(audio, (*ppSourceVoice)->src.bufferLock)

	if ((*ppSourceVoice)->src.format->wFormatTag == FAUDIO_FORMAT_EXTENSIBLE)
	{
		FAudioWaveFormatExtensible *fmtex = (FAudioWaveFormatExtensible*) (*ppSourceVoice)->src.format;

		#define COMPARE_GUID(type) \
			(FAudio_memcmp( \
				&fmtex->SubFormat, \
				&DATAFORMAT_SUBTYPE_##type, \
				sizeof(FAudioGUID) \
			) == 0)
		if (COMPARE_GUID(PCM))
		{
			#define DECODER(bit) \
				if (fmtex->Format.wBitsPerSample == bit) \
				{ \
					(*ppSourceVoice)->src.decode = FAudio_INTERNAL_DecodePCM##bit; \
				}
			DECODER(16)
			else DECODER(8)
			else DECODER(24)
			else DECODER(32)
			else
			{
				LOG_ERROR(
					audio,
					"Unrecognized wBitsPerSample: %d",
					fmtex->Format.wBitsPerSample
				)
				FAudio_assert(0 && "Unrecognized wBitsPerSample!");
			}
			#undef DECODER
		}
		else if (COMPARE_GUID(IEEE_FLOAT))
		{
			/* FIXME: Weird behavior!
			 * Prototype creates a source with the IEEE_FLOAT tag,
			 * but it's actually PCM16. It seems to prioritize
			 * wBitsPerSample over the format tag. Not sure if we
			 * should fold this section into the section above...?
			 * -flibit
			 */
			if (fmtex->Format.wBitsPerSample == 16)
			{
				(*ppSourceVoice)->src.decode = FAudio_INTERNAL_DecodePCM16;
			}
			else
			{
				(*ppSourceVoice)->src.decode = FAudio_INTERNAL_DecodePCM32F;
			}
		}
		else if (	COMPARE_GUID(WMAUDIO2) ||
				COMPARE_GUID(WMAUDIO3) ||
				COMPARE_GUID(WMAUDIO_LOSSLESS)	)
		{
#ifdef HAVE_WMADEC
			if (FAudio_WMADEC_init(*ppSourceVoice, fmtex->SubFormat.Data1) != 0)
			{
				(*ppSourceVoice)->src.decode = FAudio_INTERNAL_DecodeWMAERROR;
			}
#else
			FAudio_assert(0 && "xWMA is not supported!");
			(*ppSourceVoice)->src.decode = FAudio_INTERNAL_DecodeWMAERROR;
#endif /* HAVE_WMADEC */
		}
		else
		{
			FAudio_assert(0 && "Unsupported WAVEFORMATEXTENSIBLE subtype!");
		}
		#undef COMPARE_GUID
	}
	else if ((*ppSourceVoice)->src.format->wFormatTag == FAUDIO_FORMAT_XMAUDIO2)
	{
#ifdef HAVE_WMADEC
		if (FAudio_WMADEC_init(*ppSourceVoice, FAUDIO_FORMAT_XMAUDIO2) != 0)
		{
			(*ppSourceVoice)->src.decode = FAudio_INTERNAL_DecodeWMAERROR;
		}
#else
		FAudio_assert(0 && "XMA2 is not supported!");
		(*ppSourceVoice)->src.decode = FAudio_INTERNAL_DecodeWMAERROR;
#endif /* HAVE_WMADEC */
	}
	else if ((*ppSourceVoice)->src.format->wFormatTag == FAUDIO_FORMAT_MSADPCM)
	{
		(*ppSourceVoice)->src.decode = ((*ppSourceVoice)->src.format->nChannels == 2) ?
			FAudio_INTERNAL_DecodeStereoMSADPCM :
			FAudio_INTERNAL_DecodeMonoMSADPCM;
	}
	else
	{
		FAudio_assert(0 && "Unsupported format tag!");
	}

	if ((*ppSourceVoice)->src.format->nChannels == 1)
	{
		(*ppSourceVoice)->src.resample = FAudio_INTERNAL_ResampleMono;
	}
	else if ((*ppSourceVoice)->src.format->nChannels == 2)
	{
		(*ppSourceVoice)->src.resample = FAudio_INTERNAL_ResampleStereo;
	}
	else
	{
		(*ppSourceVoice)->src.resample = FAudio_INTERNAL_ResampleGeneric;
	}

	(*ppSourceVoice)->src.curBufferOffset = 0;

	/* Sends/Effects */
	FAudio_INTERNAL_VoiceOutputFrequency(*ppSourceVoice, pSendList);
	FAudioVoice_SetEffectChain(*ppSourceVoice, pEffectChain);

	/* Default Levels */
	(*ppSourceVoice)->volume = 1.0f;
	(*ppSourceVoice)->channelVolume = (float*) audio->pMalloc(
		sizeof(float) * (*ppSourceVoice)->outputChannels
	);
	for (i = 0; i < (*ppSourceVoice)->outputChannels; i += 1)
	{
		(*ppSourceVoice)->channelVolume[i] = 1.0f;
	}

	FAudioVoice_SetOutputVoices(*ppSourceVoice, pSendList);

	/* Filters */
	if (Flags & FAUDIO_VOICE_USEFILTER)
	{
		(*ppSourceVoice)->filterState = (FAudioFilterState*) audio->pMalloc(
			sizeof(FAudioFilterState) * (*ppSourceVoice)->src.format->nChannels
		);
		FAudio_zero(
			(*ppSourceVoice)->filterState,
			sizeof(FAudioFilterState) * (*ppSourceVoice)->src.format->nChannels
		);
	}

	/* Sample Storage */
	(*ppSourceVoice)->src.decodeSamples = (uint32_t) (FAudio_ceil(
		(double) audio->updateSize *
		(double) MaxFrequencyRatio *
		(double) (*ppSourceVoice)->src.format->nSamplesPerSec /
		(double) audio->master->master.inputSampleRate
	)) + EXTRA_DECODE_PADDING * (*ppSourceVoice)->src.format->nChannels;
	FAudio_INTERNAL_ResizeDecodeCache(
		audio,
		((*ppSourceVoice)->src.decodeSamples + EXTRA_DECODE_PADDING) * (*ppSourceVoice)->src.format->nChannels
	);

	LOG_INFO(audio, "-> %p", (void*) (*ppSourceVoice))

	/* Add to list, finally. */
	LinkedList_PrependEntry(
		&audio->sources,
		*ppSourceVoice,
		audio->sourceLock,
		audio->pMalloc
	);
	FAudio_AddRef(audio);

#ifdef FAUDIO_DUMP_VOICES
	FAudio_DUMPVOICE_Init(*ppSourceVoice);
#endif /* FAUDIO_DUMP_VOICES */

	LOG_API_EXIT(audio)
	return 0;
}